

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::SplitPath
               (string *p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,bool expand_home_dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  passwd *ppVar4;
  long lVar5;
  char *pcVar6;
  string root;
  string homedir;
  string local_50 [32];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(components);
  paVar1 = &root.field_2;
  root._M_string_length = 0;
  root.field_2._M_local_buf[0] = '\0';
  root._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = SplitPathRootComponent(p,&root);
  if (((expand_home_dir) && (root._M_string_length != 0)) && (*root._M_dataplus._M_p == '~')) {
    homedir._M_dataplus._M_p = (pointer)&homedir.field_2;
    homedir._M_string_length = 0;
    homedir.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::substr((ulong)local_50,(ulong)&root);
    std::__cxx11::string::operator=((string *)&root,local_50);
    std::__cxx11::string::~string(local_50);
    if (root._M_string_length == 1) {
      GetEnv("HOME",&homedir);
    }
    else {
      ppVar4 = getpwnam(root._M_dataplus._M_p + 1);
      if ((ppVar4 != (passwd *)0x0) && (ppVar4->pw_dir != (char *)0x0)) {
        std::__cxx11::string::assign((char *)&homedir);
      }
    }
    if ((homedir._M_string_length != 0) &&
       ((homedir._M_dataplus._M_p[homedir._M_string_length - 1] == '\\' ||
        (homedir._M_dataplus._M_p[homedir._M_string_length - 1] == '/')))) {
      std::__cxx11::string::resize((ulong)&homedir);
    }
    SplitPath(&homedir,components,true);
    std::__cxx11::string::~string((string *)&homedir);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,&root);
  }
  std::__cxx11::string::~string((string *)&root);
  lVar5 = 0;
  pcVar6 = pcVar3;
  do {
    cVar2 = *pcVar6;
    if ((cVar2 == '/') || (cVar2 == '\\')) {
      root._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&root,pcVar3,pcVar6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                 &root);
      std::__cxx11::string::~string((string *)&root);
      pcVar3 = pcVar6 + 1;
    }
    else if (cVar2 == '\0') {
      if (lVar5 != 0) {
        root._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&root,pcVar3,pcVar6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                   &root);
        std::__cxx11::string::~string((string *)&root);
      }
      return;
    }
    pcVar6 = pcVar6 + 1;
    lVar5 = lVar5 + -1;
  } while( true );
}

Assistant:

void SystemTools::SplitPath(const std::string& p,
                            std::vector<std::string>& components,
                            bool expand_home_dir)
{
  const char* c;
  components.clear();

  // Identify the root component.
  {
    std::string root;
    c = SystemTools::SplitPathRootComponent(p, &root);

    // Expand home directory references if requested.
    if (expand_home_dir && !root.empty() && root[0] == '~') {
      std::string homedir;
      root = root.substr(0, root.size() - 1);
      if (root.size() == 1) {
#if defined(_WIN32) && !defined(__CYGWIN__)
        if (!SystemTools::GetEnv("USERPROFILE", homedir))
#endif
          SystemTools::GetEnv("HOME", homedir);
      }
#ifdef HAVE_GETPWNAM
      else if (passwd* pw = getpwnam(root.c_str() + 1)) {
        if (pw->pw_dir) {
          homedir = pw->pw_dir;
        }
      }
#endif
      if (!homedir.empty() &&
          (homedir.back() == '/' || homedir.back() == '\\')) {
        homedir.resize(homedir.size() - 1);
      }
      SystemTools::SplitPath(homedir, components);
    } else {
      components.push_back(root);
    }
  }

  // Parse the remaining components.
  const char* first = c;
  const char* last = first;
  for (; *last; ++last) {
    if (*last == '/' || *last == '\\') {
      // End of a component.  Save it.
      components.push_back(std::string(first, last));
      first = last + 1;
    }
  }

  // Save the last component unless there were no components.
  if (last != c) {
    components.push_back(std::string(first, last));
  }
}